

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

OnCallSpec<const_solitaire::interfaces::Solitaire_&()> * __thiscall
testing::internal::FunctionMocker<const_solitaire::interfaces::Solitaire_&()>::FindOnCallSpec
          (FunctionMocker<const_solitaire::interfaces::Solitaire_&()> *this,ArgumentTuple *args)

{
  OnCallSpec<const_solitaire::interfaces::Solitaire_&()> *this_00;
  bool bVar1;
  reference ppvVar2;
  OnCallSpec<const_solitaire::interfaces::Solitaire_&()> *spec;
  const_reverse_iterator it;
  ArgumentTuple *args_local;
  FunctionMocker<const_solitaire::interfaces::Solitaire_&()> *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
        )(__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
          )args;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::rbegin
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)&stack0xffffffffffffffd8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::rend
              ((vector<const_void_*,_std::allocator<const_void_*>_> *)&spec);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&stack0xffffffffffffffd8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&spec);
    if (!bVar1) {
      return (OnCallSpec<const_solitaire::interfaces::Solitaire_&()> *)0x0;
    }
    ppvVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                           *)&stack0xffffffffffffffd8);
    this_00 = (OnCallSpec<const_solitaire::interfaces::Solitaire_&()> *)*ppvVar2;
    bVar1 = OnCallSpec<const_solitaire::interfaces::Solitaire_&()>::Matches
                      (this_00,(ArgumentTuple *)it.current._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  return this_00;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }